

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CCtx * ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  int iVar1;
  void *pvVar2;
  ZSTD_cpuid_t cpuid;
  ZSTD_CCtx *cctx;
  ZSTD_cwksp ws;
  size_t workspaceSize_local;
  void *workspace_local;
  
  if (workspaceSize < 0x1479) {
    workspace_local = (void *)0x0;
  }
  else if (((ulong)workspace & 7) == 0) {
    ws._64_8_ = workspaceSize;
    ZSTD_cwksp_init((ZSTD_cwksp *)&cctx,workspace,workspaceSize,ZSTD_cwksp_static_alloc);
    workspace_local = ZSTD_cwksp_reserve_object((ZSTD_cwksp *)&cctx,0x1478);
    if (workspace_local == (void *)0x0) {
      workspace_local = (void *)0x0;
    }
    else {
      memset(workspace_local,0,0x1478);
      ZSTD_cwksp_move((ZSTD_cwksp *)((long)workspace_local + 0x290),(ZSTD_cwksp *)&cctx);
      *(undefined8 *)((long)workspace_local + 0x370) = ws._64_8_;
      iVar1 = ZSTD_cwksp_check_available((ZSTD_cwksp *)((long)workspace_local + 0x290),0x4ed8);
      if (iVar1 == 0) {
        workspace_local = (void *)0x0;
      }
      else {
        pvVar2 = ZSTD_cwksp_reserve_object((ZSTD_cwksp *)((long)workspace_local + 0x290),0x1600);
        *(void **)((long)workspace_local + 0xc68) = pvVar2;
        pvVar2 = ZSTD_cwksp_reserve_object((ZSTD_cwksp *)((long)workspace_local + 0x290),0x1600);
        *(void **)((long)workspace_local + 0xc70) = pvVar2;
        pvVar2 = ZSTD_cwksp_reserve_object((ZSTD_cwksp *)((long)workspace_local + 0x290),0x22d8);
        *(void **)((long)workspace_local + 0xda8) = pvVar2;
        cpuid = ZSTD_cpuid();
        iVar1 = ZSTD_cpuid_bmi2(cpuid);
        *(int *)((long)workspace_local + 8) = iVar1;
      }
    }
  }
  else {
    workspace_local = (void *)0x0;
  }
  return (ZSTD_CCtx *)workspace_local;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void* workspace, size_t workspaceSize)
{
    ZSTD_cwksp ws;
    ZSTD_CCtx* cctx;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);

    cctx = (ZSTD_CCtx*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CCtx));
    if (cctx == NULL) return NULL;

    ZSTD_memset(cctx, 0, sizeof(ZSTD_CCtx));
    ZSTD_cwksp_move(&cctx->workspace, &ws);
    cctx->staticSize = workspaceSize;

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (!ZSTD_cwksp_check_available(&cctx->workspace, ENTROPY_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t))) return NULL;
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->blockState.nextCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cctx->workspace, ENTROPY_WORKSPACE_SIZE);
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}